

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ChunkVectorInfo::TemplatedGetSelVector<duckdb::CommittedVersionOperator>
          (ChunkVectorInfo *this,transaction_t start_time,transaction_t transaction_id,
          SelectionVector *sel_vector,idx_t max_count)

{
  sel_t *psVar1;
  ulong uVar2;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  
  iVar3 = max_count;
  if (this->same_inserted_id == true) {
    if (this->any_deleted != false) {
      psVar1 = sel_vector->sel_vector;
      iVar3 = 0;
      for (iVar4 = 0; max_count != iVar4; iVar4 = iVar4 + 1) {
        uVar2 = this->deleted[iVar4];
        if ((start_time <= uVar2 && uVar2 < 0x4000000000000060) || (uVar2 == 0xfffffffffffffffe)) {
          psVar1[iVar3] = (sel_t)iVar4;
          iVar3 = iVar3 + 1;
        }
      }
    }
  }
  else if (this->any_deleted == false) {
    psVar1 = sel_vector->sel_vector;
    for (iVar4 = 0; max_count != iVar4; iVar4 = iVar4 + 1) {
      psVar1[iVar4] = (sel_t)iVar4;
    }
  }
  else {
    psVar1 = sel_vector->sel_vector;
    iVar3 = 0;
    for (iVar4 = 0; max_count != iVar4; iVar4 = iVar4 + 1) {
      uVar2 = this->deleted[iVar4];
      if ((start_time <= uVar2 && uVar2 < 0x4000000000000060) || (uVar2 == 0xfffffffffffffffe)) {
        psVar1[iVar3] = (sel_t)iVar4;
        iVar3 = iVar3 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

idx_t ChunkVectorInfo::TemplatedGetSelVector(transaction_t start_time, transaction_t transaction_id,
                                             SelectionVector &sel_vector, idx_t max_count) const {
	idx_t count = 0;
	if (same_inserted_id && !any_deleted) {
		// all tuples have the same inserted id: and no tuples were deleted
		if (OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return max_count;
		} else {
			return 0;
		}
	} else if (same_inserted_id) {
		if (!OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return 0;
		}
		// have to check deleted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else if (!any_deleted) {
		// have to check inserted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else {
		// have to check both flags
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i]) &&
			    OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	}
	return count;
}